

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CmdLineParser.cpp
# Opt level: O0

bool axl::sl::CmdLineParserRoot::parseSwitch
               (ArgKind argKind,StringRef *arg,String *switchName,String *value)

{
  int iVar1;
  EVP_PKEY_CTX *dst;
  EVP_PKEY_CTX *pEVar2;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_RCX;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDX;
  EVP_PKEY_CTX *src;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RSI;
  int in_EDI;
  char *p0;
  char *end;
  char *p;
  undefined7 in_stack_ffffffffffffffc0;
  byte in_stack_ffffffffffffffc7;
  EVP_PKEY_CTX *local_28;
  
  dst = (EVP_PKEY_CTX *)StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::cp(in_RSI);
  pEVar2 = (EVP_PKEY_CTX *)StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getEnd(in_RSI);
  local_28 = dst;
  if (in_EDI == 1) {
    StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
              (in_RDX,(EVP_PKEY_CTX *)(ulong)(uint)(int)(char)*dst,src);
    local_28 = dst + 1;
  }
  else {
    while( true ) {
      in_stack_ffffffffffffffc7 = 0;
      if ((local_28 < pEVar2) && (in_stack_ffffffffffffffc7 = 0, *local_28 != (EVP_PKEY_CTX)0x3d)) {
        iVar1 = isspace((int)(char)*local_28);
        in_stack_ffffffffffffffc7 = iVar1 != 0 ^ 0xff;
      }
      if ((in_stack_ffffffffffffffc7 & 1) == 0) break;
      local_28 = local_28 + 1;
    }
    StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy(in_RDX,dst,local_28 + -(long)dst);
  }
  if ((local_28 < pEVar2) && (iVar1 = isspace((int)(char)*local_28), iVar1 == 0)) {
    if (*local_28 == (EVP_PKEY_CTX)0x3d) {
      local_28 = local_28 + 1;
    }
    StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
              (in_RCX,local_28,pEVar2 + -(long)local_28);
  }
  else {
    StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  }
  return true;
}

Assistant:

bool
CmdLineParserRoot::parseSwitch(
	ArgKind argKind,
	const sl::StringRef& arg,
	sl::String* switchName,
	sl::String* value
) {
	const char* p = arg.cp();
	const char* end = arg.getEnd();

	if (argKind == ArgKind_CharSwitch) {
		switchName->copy(*p);
		p++;
	} else {
		const char* p0 = p;
		while (p < end && *p != '=' && !isspace(*p))
			p++;

		switchName->copy(p0, p - p0);
	}

	if (p < end && !isspace(*p)) { // has value
		if (*p == '=')
			p++;

		value->copy(p, end - p);
	} else {
		value->clear();
	}

	return true;
}